

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall ncnn::NetPrivate::update_input_output_indexes(NetPrivate *this)

{
  int iVar1;
  pointer piVar2;
  iterator iVar3;
  undefined8 in_RAX;
  pointer ppLVar4;
  pointer pBVar5;
  pointer ppLVar6;
  pointer pBVar7;
  ulong uVar8;
  long lVar9;
  int blob_index;
  undefined8 local_38;
  
  piVar2 = (this->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  piVar2 = (this->output_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->output_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->output_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  ppLVar4 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppLVar6 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  local_38 = in_RAX;
  if (ppLVar6 != ppLVar4) {
    uVar8 = 0;
    do {
      if (ppLVar4[uVar8]->typeindex == 0x10) {
        iVar1 = *(ppLVar4[uVar8]->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_38 = CONCAT44(iVar1,(int)local_38);
        iVar3._M_current =
             (this->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->input_blob_indexes,iVar3,
                     (int *)((long)&local_38 + 4));
          ppLVar4 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppLVar6 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          *iVar3._M_current = iVar1;
          (this->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)ppLVar6 - (long)ppLVar4 >> 3));
  }
  pBVar5 = (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar7 = (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar7 != pBVar5) {
    lVar9 = 0x24;
    uVar8 = 0;
    do {
      if ((*(int *)((long)pBVar5 + lVar9 + -4) != -1) &&
         (*(int *)((long)&(pBVar5->name)._M_dataplus._M_p + lVar9) == -1)) {
        local_38 = CONCAT44(local_38._4_4_,(int)uVar8);
        iVar3._M_current =
             (this->output_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->output_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->output_blob_indexes,iVar3,(int *)&local_38);
          pBVar5 = (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                   .super__Vector_impl_data._M_start;
          pBVar7 = (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        }
        else {
          *iVar3._M_current = (int)uVar8;
          (this->output_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x70;
    } while (uVar8 < (ulong)(((long)pBVar7 - (long)pBVar5 >> 4) * 0x6db6db6db6db6db7));
  }
  return;
}

Assistant:

void NetPrivate::update_input_output_indexes()
{
    input_blob_indexes.clear();
    output_blob_indexes.clear();

    for (size_t i = 0; i < layers.size(); i++)
    {
        if (layers[i]->typeindex == LayerType::Input)
        {
            int blob_index = layers[i]->tops[0];
            input_blob_indexes.push_back(blob_index);
        }
    }

    for (size_t i = 0; i < blobs.size(); i++)
    {
        if (blobs[i].producer != -1 && blobs[i].consumer == -1)
        {
            output_blob_indexes.push_back(i);
        }
    }
}